

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O0

void __thiscall
Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_void>::Timer
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_void> *this,int *time_,
          function<void_()> *func_)

{
  function<void_()> *func__local;
  int *time__local;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_void> *this_local;
  
  std::function<void_()>::function(&this->m_callable,func_);
  std::atomic<bool>::atomic(&this->m_running,false);
  std::atomic<bool>::atomic(&this->m_got_stopped,false);
  std::thread::thread(&this->m_timer_thread);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&this->m_cycle_time,time_);
  std::condition_variable::condition_variable(&this->m_cond_cycle);
  memset(&this->m_cycle_mutex,0,0x28);
  std::mutex::mutex(&this->m_cycle_mutex);
  return;
}

Assistant:

Timer(const int &time_, const std::function<F(void)> &func_)
      : m_cycle_time(Duration(time_)), m_callable(func_), m_cond_cycle(),
        m_cycle_mutex(){}